

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::GenerateFastRealStackArgumentsLdLen(Lowerer *this,Instr *ldLen)

{
  bool bVar1;
  IntConstOpnd *src;
  Instr *pIVar2;
  Opnd *dst;
  
  bVar1 = Func::IsInlinee(ldLen->m_func);
  if (bVar1) {
    dst = ldLen->m_dst;
    src = IR::IntConstOpnd::New((ulong)ldLen->m_func->actualCount - 1,TyUint32,ldLen->m_func,false);
  }
  else {
    pIVar2 = LowererMD::LoadInputParamCount(&this->m_lowererMD,ldLen,-1,false);
    src = (IntConstOpnd *)IR::Opnd::AsRegOpnd(pIVar2->m_dst);
    dst = ldLen->m_dst;
  }
  InsertMove(dst,&src->super_Opnd,ldLen,true);
  IR::Instr::Remove(ldLen);
  return false;
}

Assistant:

bool
Lowerer::GenerateFastRealStackArgumentsLdLen(IR::Instr *ldLen)
{
    if(ldLen->m_func->IsInlinee())
    {
        //Get the length of the arguments
        Lowerer::InsertMove(ldLen->GetDst(),
                               IR::IntConstOpnd::New(ldLen->m_func->actualCount - 1, TyUint32, ldLen->m_func),
                               ldLen);
    }
    else
    {
        IR::Instr *loadInputParamCountInstr = this->m_lowererMD.LoadInputParamCount(ldLen, -1);
        IR::RegOpnd *actualCountOpnd = loadInputParamCountInstr->GetDst()->AsRegOpnd();
        Lowerer::InsertMove(ldLen->GetDst(), actualCountOpnd, ldLen);
    }
    ldLen->Remove();
    return false;
}